

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isNearestMipmapLinearSampleResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               LookupPrecision *prec,Vec2 *coord,int coordZ,Vec2 *fBounds,Vec4 *result)

{
  bool bVar1;
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  int iVar2;
  int iVar3;
  deInt32 dVar4;
  deInt32 dVar5;
  deInt32 dVar6;
  deInt32 dVar7;
  deInt32 dVar8;
  float fVar9;
  float fVar10;
  float x;
  undefined1 local_bc [8];
  Vec4 c1;
  Vec4 c0;
  int i1;
  int j1;
  int i0;
  int j0;
  int maxJ1;
  int minJ1;
  int maxJ0;
  int minJ0;
  int maxI1;
  int minI1;
  int maxI0;
  int minI0;
  Vec2 vBounds1;
  Vec2 vBounds0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  int h1;
  int h0;
  int w1;
  int w0;
  int coordZ_local;
  Vec2 *coord_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level1_local;
  ConstPixelBufferAccess *level0_local;
  
  dim = ConstPixelBufferAccess::getWidth(level0);
  dim_00 = ConstPixelBufferAccess::getWidth(level1);
  dim_01 = ConstPixelBufferAccess::getHeight(level0);
  dim_02 = ConstPixelBufferAccess::getHeight(level1);
  bVar1 = sampler->normalizedCoords;
  fVar9 = Vector<float,_2>::x(coord);
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,(bool)(bVar1 & 1),dim,fVar9,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar9 = Vector<float,_2>::x(coord);
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds0,(bool)(bVar1 & 1),dim_00,fVar9,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar9 = Vector<float,_2>::y(coord);
  iVar2 = Vector<int,_3>::y(&prec->coordBits);
  iVar3 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds1,(bool)(bVar1 & 1),dim_01,fVar9,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar9 = Vector<float,_2>::y(coord);
  iVar2 = Vector<int,_3>::y(&prec->coordBits);
  iVar3 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI0,(bool)(bVar1 & 1),dim_02,fVar9,iVar2,iVar3);
  fVar9 = Vector<float,_2>::x(&uBounds1);
  dVar4 = deFloorFloatToInt32(fVar9);
  fVar9 = Vector<float,_2>::y(&uBounds1);
  dVar5 = deFloorFloatToInt32(fVar9);
  fVar9 = Vector<float,_2>::x(&vBounds0);
  fVar9 = (float)deFloorFloatToInt32(fVar9);
  fVar10 = Vector<float,_2>::y(&vBounds0);
  dVar6 = deFloorFloatToInt32(fVar10);
  fVar10 = Vector<float,_2>::x(&vBounds1);
  j1 = deFloorFloatToInt32(fVar10);
  fVar10 = Vector<float,_2>::y(&vBounds1);
  dVar7 = deFloorFloatToInt32(fVar10);
  fVar10 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
  fVar10 = (float)deFloorFloatToInt32(fVar10);
  x = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
  dVar8 = deFloorFloatToInt32(x);
  do {
    i1 = dVar4;
    if (dVar7 < j1) {
      return false;
    }
    for (; c0.m_data[3] = fVar10, i1 <= dVar5; i1 = i1 + 1) {
      for (; c0.m_data[2] = fVar9, (int)c0.m_data[3] <= dVar8;
          c0.m_data[3] = (float)((int)c0.m_data[3] + 1)) {
        for (; (int)c0.m_data[2] <= dVar6; c0.m_data[2] = (float)((int)c0.m_data[2] + 1)) {
          iVar2 = TexVerifierUtil::wrap(sampler->wrapS,i1,dim);
          iVar3 = TexVerifierUtil::wrap(sampler->wrapT,j1,dim_01);
          lookup<float>((tcu *)(c1.m_data + 2),level0,sampler,iVar2,iVar3,coordZ);
          iVar2 = TexVerifierUtil::wrap(sampler->wrapS,(int)c0.m_data[2],dim_00);
          iVar3 = TexVerifierUtil::wrap(sampler->wrapT,(int)c0.m_data[3],dim_02);
          lookup<float>((tcu *)local_bc,level1,sampler,iVar2,iVar3,coordZ);
          bVar1 = isLinearRangeValid(prec,(Vec4 *)(c1.m_data + 2),(Vec4 *)local_bc,fBounds,result);
          if (bVar1) {
            return true;
          }
        }
      }
    }
    j1 = j1 + 1;
  } while( true );
}

Assistant:

static bool isNearestMipmapLinearSampleResultValid (const ConstPixelBufferAccess&	level0,
													const ConstPixelBufferAccess&	level1,
													const Sampler&					sampler,
													const LookupPrecision&			prec,
													const Vec2&						coord,
													const int						coordZ,
													const Vec2&						fBounds,
													const Vec4&						result)
{
	const int		w0				= level0.getWidth();
	const int		w1				= level1.getWidth();
	const int		h0				= level0.getHeight();
	const int		h1				= level1.getHeight();

	const Vec2		uBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2		uBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2		vBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2		vBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int		minI0			= deFloorFloatToInt32(uBounds0.x());
	const int		maxI0			= deFloorFloatToInt32(uBounds0.y());
	const int		minI1			= deFloorFloatToInt32(uBounds1.x());
	const int		maxI1			= deFloorFloatToInt32(uBounds1.y());
	const int		minJ0			= deFloorFloatToInt32(vBounds0.x());
	const int		maxJ0			= deFloorFloatToInt32(vBounds0.y());
	const int		minJ1			= deFloorFloatToInt32(vBounds1.x());
	const int		maxJ1			= deFloorFloatToInt32(vBounds1.y());

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					const Vec4	c0	= lookup<float>(level0, sampler, wrap(sampler.wrapS, i0, w0), wrap(sampler.wrapT, j0, h0), coordZ);
					const Vec4	c1	= lookup<float>(level1, sampler, wrap(sampler.wrapS, i1, w1), wrap(sampler.wrapT, j1, h1), coordZ);

					if (isLinearRangeValid(prec, c0, c1, fBounds, result))
						return true;
				}
			}
		}
	}

	return false;
}